

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ParseHex<unsigned_char>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          string_view hex_str)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> *p_Var4;
  long in_FS_OFFSET;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> local_58;
  _Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  TryParseHex<unsigned_char>
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)&local_38,
             hex_str);
  local_58._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var4 = &local_58;
  if (local_38._M_engaged != false) {
    p_Var4 = &local_38._M_payload;
  }
  puVar1 = (((_Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> *)
            &(p_Var4->_M_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)->
           _M_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (((_Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> *)
   &(p_Var4->_M_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)->_M_value)
  .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  puVar2 = (((_Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> *)
            &(p_Var4->_M_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)->
           _M_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (((_Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> *)
            &(p_Var4->_M_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)->
           _M_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (((_Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> *)
   &(p_Var4->_M_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)->_M_value)
  .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (((_Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> *)
   &(p_Var4->_M_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)->_M_value)
  .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = puVar2;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = puVar3;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar1;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_58._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::_M_reset
            (&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<Byte> ParseHex(std::string_view hex_str)
{
    return TryParseHex<Byte>(hex_str).value_or(std::vector<Byte>{});
}